

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_cmd.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  intptr_t iVar2;
  bool bVar3;
  int iVar4;
  int h;
  char *pcVar5;
  Rasterizer *pRVar6;
  uint8_t *__s;
  int iVar7;
  ulong uVar8;
  long lVar9;
  CmdLine cmd;
  Image image;
  CmdLine local_d8;
  Image local_c8;
  double local_a8;
  double dStack_a0;
  double local_98 [5];
  char *local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_d8.argc = argc;
  local_d8.argv = argv;
  bVar3 = CmdLine::hasKey(&local_d8,"--help");
  if ((((bVar3) || (bVar3 = CmdLine::hasKey(&local_d8,"--width"), !bVar3)) ||
      (bVar3 = CmdLine::hasKey(&local_d8,"--height"), !bVar3)) ||
     (bVar3 = CmdLine::hasKey(&local_d8,"--output"), !bVar3)) {
    puts("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]");
    iVar4 = 1;
  }
  else {
    pcVar5 = CmdLine::valueOf(&local_d8,"--width");
    h = 0;
    iVar4 = 0;
    if (pcVar5 != (char *)0x0) {
      iVar4 = atoi(pcVar5);
    }
    pcVar5 = CmdLine::valueOf(&local_d8,"--height");
    if (pcVar5 != (char *)0x0) {
      h = atoi(pcVar5);
    }
    bVar3 = CmdLine::hasKey(&local_d8,"--even-odd");
    local_a8 = (double)CONCAT71(local_a8._1_7_,bVar3);
    local_70 = CmdLine::valueOf(&local_d8,"--output");
    local_c8._width = 0;
    local_c8._height = 0;
    local_c8._stride = 0;
    local_c8._data = (uint8_t *)0x0;
    Image::create(&local_c8,iVar4,h);
    iVar2 = local_c8._stride;
    lVar9 = (long)local_c8._width;
    if ((0 < lVar9) && (0 < local_c8._height)) {
      __s = local_c8._data;
      iVar7 = local_c8._height;
      do {
        memset(__s,0,lVar9 << 2);
        __s = __s + iVar2;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    pRVar6 = Rasterizer::newById(&local_c8,1,0);
    pRVar6->_fillMode = (uint)(local_a8._0_1_ ^ 1);
    if (1 < argc) {
      iVar7 = 0;
      uVar8 = 1;
      do {
        pcVar5 = argv[uVar8];
        if ((*pcVar5 != '-') || (pcVar5[1] != '-')) {
          dVar1 = atof(pcVar5);
          local_98[iVar7] = dVar1;
          if (iVar7 == 3) {
            if (((((double)iVar4 < local_98[2]) || (local_98[2] < 0.0)) || (local_98[3] < 0.0)) ||
               ((double)h < local_98[3])) {
LAB_0010264a:
              puts("Coordinates out of range");
              goto LAB_00102656;
            }
            local_58 = local_98[0];
            dStack_50 = local_98[1];
            local_48 = local_98[2];
            dStack_40 = local_98[3];
            local_68 = local_98[2];
            dStack_60 = local_98[3];
            (*pRVar6->_vptr_Rasterizer[4])(pRVar6,&local_58,2);
            local_98[0] = local_68;
            local_98[1] = dStack_60;
            iVar7 = 2;
          }
          else if (iVar7 == 1) {
            local_a8 = local_98[0];
            dStack_a0 = local_98[1];
            if ((((double)iVar4 < local_98[0]) || (local_98[0] < 0.0)) ||
               ((local_98[1] < 0.0 || (iVar7 = 2, (double)h < local_98[1])))) goto LAB_0010264a;
          }
          else {
            iVar7 = iVar7 + 1;
          }
        }
        uVar8 = uVar8 + 1;
      } while ((uint)argc != uVar8);
      if (1 < iVar7) {
        local_58 = local_98[0];
        dStack_50 = local_98[1];
        local_48 = local_a8;
        dStack_40 = dStack_a0;
        (*pRVar6->_vptr_Rasterizer[4])(pRVar6,&local_58,2);
      }
    }
    (*pRVar6->_vptr_Rasterizer[5])(pRVar6,0xffffffff);
    (*pRVar6->_vptr_Rasterizer[1])(pRVar6);
    pcVar5 = local_70;
    bVar3 = Image::writeBmp(&local_c8,local_70);
    iVar4 = 0;
    if (!bVar3) {
      printf("Cannot open file \'%s\' for writing\n",pcVar5);
LAB_00102656:
      iVar4 = 1;
    }
    if (local_c8._data != (uint8_t *)0x0) {
      free(local_c8._data);
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  CmdLine cmd(argc, argv);
  int i;

  if (cmd.hasKey("--help") ||
     !cmd.hasKey("--width") ||
     !cmd.hasKey("--height") ||
     !cmd.hasKey("--output")) {
    printf("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]\n");
    return 1;
  }

  int w = cmd.intValueOf("--width");
  int h = cmd.intValueOf("--height");
  bool nonZero = !cmd.hasKey("--even-odd");
  const char* fileName = cmd.valueOf("--output");

  uint32_t color = 0xFFFFFFFF;

  Image image;
  image.create(w, h);
  image.fillAll(0);

  // Rasterize the polygon.
  Rasterizer* ras = Rasterizer::newById(image, Rasterizer::kIdA1, 0);
  ras->setFillMode(nonZero ? Rasterizer::kFillNonZero : Rasterizer::kFillEvenOdd);

  double line[4];
  double start[2];
  int index = 0;

  for (i = 1; i < argc; i++) {
    const char* value = argv[i];
    if (value[0] == '-' && value[1] == '-')
      continue;

    // Initial point, required to close the polygon.
    line[index++] = atof(value);
    if (index == 2) {
      double x0 = line[0];
      double y0 = line[1];

      start[0] = x0;
      start[1] = y0;

      if (x0 < 0 || y0 < 0 || x0 > w || y0 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }
    }

    if (index == 4) {
      double x0 = line[0];
      double y0 = line[1];
      double x1 = line[2];
      double y1 = line[3];

      if (x1 < 0 || y1 < 0 || x1 > w || y1 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }

      Point poly[] = { { x0, y0 }, { x1, y1 } };
      ras->addPoly(poly, 2);

      line[0] = x1;
      line[1] = y1;
      index = 2;
    }
  }

  // Close the polygon
  if (index >= 2) {
    double x0 = line[0];
    double y0 = line[1];
    double x1 = start[0];
    double y1 = start[1];

    Point poly[] = { { x0, y0 }, { x1, y1 } };
    ras->addPoly(poly, 2);
  }

  ras->render(color);
  delete ras;

  if (!image.writeBmp(fileName)) {
    printf("Cannot open file '%s' for writing\n", fileName);
    return 1;
  }

  return 0;
}